

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_base.c
# Opt level: O1

MPP_RET hal_vp8e_enc_strm_code(void *hal,HalEncTask *task)

{
  Vp8ePutBitBuf *bitbuf;
  RK_U8 *data;
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 *puVar7;
  byte *pbVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 uVar11;
  RK_U32 i;
  int iVar12;
  RK_S32 RVar13;
  RK_S32 RVar14;
  size_t sVar15;
  RK_U8 *pRVar16;
  void *pvVar17;
  undefined8 *puVar18;
  RK_U32 *buf;
  RK_U32 *pRVar19;
  uint *puVar20;
  byte bVar21;
  long lVar22;
  ulong uVar23;
  HalVp8eCtx *ctx;
  uint uVar24;
  undefined1 *puVar25;
  uint uVar26;
  int iVar27;
  long lVar28;
  ulong uVar29;
  undefined8 *puVar30;
  char *pcVar31;
  undefined8 *puVar32;
  long lVar33;
  uint uVar34;
  uint uVar35;
  char *pcVar36;
  int iVar37;
  RK_U32 RVar38;
  int iVar39;
  long lVar40;
  bool bVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  RK_S32 ref_update [4];
  RK_S32 mode_update [4];
  VepuOffsetCfg hw_offset;
  int local_90;
  uint auStack_88 [4];
  uint auStack_78 [5];
  VepuOffsetCfg local_64;
  
  lVar22 = *(long *)((long)hal + 0x70);
  *(undefined1 (*) [16])((long)hal + 0x68a0) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)hal + 0x68b0) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)hal + 0x68c0) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)hal + 0x68d0) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)hal + 0x68e0) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)hal + 0x68f0) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)hal + 0x68fc) = (undefined1  [16])0x0;
  local_64.fmt = *(MppFrameFormat *)(lVar22 + 0x24);
  local_64.width = *(RK_U32 *)(lVar22 + 0xc);
  local_64.height = *(RK_U32 *)(lVar22 + 0x10);
  local_64.hor_stride = *(RK_U32 *)(lVar22 + 0x14);
  local_64.ver_stride = *(RK_U32 *)(lVar22 + 0x18);
  local_64.offset_x = mpp_frame_get_offset_x(task->frame);
  local_64.offset_y = mpp_frame_get_offset_y(task->frame);
  get_vepu_offset_cfg(&local_64);
  iVar12 = mpp_buffer_get_fd_with_caller(task->input,"hal_vp8e_enc_strm_code");
  *(int *)((long)hal + 0x1d4) = iVar12;
  *(int *)((long)hal + 0x1dc) = iVar12;
  *(int *)((long)hal + 0x1e4) = iVar12;
  *(RK_U32 *)((long)hal + 0x1d8) = local_64.offset_byte[0];
  *(RK_U32 *)((long)hal + 0x1e0) = local_64.offset_byte[1];
  *(RK_U32 *)((long)hal + 0x1e8) = local_64.offset_byte[2];
  lVar22 = *(long *)((long)hal + 0x60);
  sVar15 = mpp_buffer_get_size_with_caller(*(MppBuffer *)(lVar22 + 0x58),"hal_vp8e_enc_strm_code");
  iVar12 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar22 + 0x58),"hal_vp8e_enc_strm_code");
  pRVar16 = (RK_U8 *)mpp_buffer_get_ptr_with_caller
                               (*(MppBuffer *)(lVar22 + 0x58),"hal_vp8e_enc_strm_code");
  lVar40 = 3;
  if (*(int *)((long)hal + 0x6924) == 0) {
    lVar40 = 10;
  }
  data = pRVar16 + lVar40;
  iVar39 = (int)lVar40;
  vp8e_set_buffer((Vp8ePutBitBuf *)((long)hal + 0x37f8),pRVar16,iVar39);
  *(int *)((long)hal + 0x194) = iVar12;
  *(int *)((long)hal + 0x198) = iVar39;
  pRVar16 = (RK_U8 *)((ulong)(data + (sVar15 & 0xffffffff) / 10) & 0xfffffffffffffff8);
  bitbuf = (Vp8ePutBitBuf *)((long)hal + 0x3820);
  iVar37 = ((uint)(data + (sVar15 & 0xffffffff) / 10) & 0xfffffff8) - (int)data;
  vp8e_set_buffer(bitbuf,data,iVar37);
  iVar37 = iVar37 + iVar39;
  *(int *)((long)hal + 0x394) = iVar12;
  *(int *)((long)hal + 0x3b4) = iVar37;
  pvVar17 = mpp_buffer_get_ptr_with_caller(*(MppBuffer *)(lVar22 + 0x58),"hal_vp8e_enc_strm_code");
  local_90 = (int)sVar15;
  iVar39 = ((int)pvVar17 + local_90 & 0xfffffff8U) - (int)pRVar16;
  vp8e_set_buffer((Vp8ePutBitBuf *)((long)hal + 0x3848),pRVar16,iVar39);
  *(int *)((long)hal + 0x398) = iVar12;
  *(int *)((long)hal + 0x3b8) = iVar37 + iVar39;
  *(int *)((long)hal + 0x19c) = iVar39;
  puVar7 = *(undefined8 **)((long)hal + 0x37e8);
  *(undefined1 *)((long)puVar7 + 0x26) = 1;
  *(undefined4 *)(puVar7 + 4) = *(undefined4 *)((long)hal + 0x6918);
  bVar41 = *(int *)((long)hal + 0x6924) == 0;
  *(bool *)((long)puVar7 + 0x24) = bVar41;
  if (bVar41) {
    *(undefined1 *)((long)puVar7 + 0x25) = 0;
    *(undefined2 *)((long)puVar7 + 0x27) = 0x101;
    *(undefined1 *)((long)puVar7 + 0x29) = 1;
    puVar18 = (undefined8 *)((long)hal + 0x3660);
    lVar22 = 4;
    do {
      if (puVar18 != puVar7) {
        puVar18[4] = 0xffffffff;
        *(undefined4 *)((long)puVar18 + 0x27) = 0;
      }
      puVar18 = puVar18 + 7;
      lVar22 = lVar22 + -1;
    } while (lVar22 != 0);
  }
  puVar18 = (undefined8 *)((long)hal + 0x3740);
  lVar22 = 0x3764;
  do {
    *(undefined8 *)((long)hal + lVar22 + -4) = 0xffffffff;
    *(undefined4 *)((long)hal + lVar22 + 3) = 0;
    lVar22 = lVar22 + 0x38;
  } while (lVar22 != 0x380c);
  puVar32 = (undefined8 *)((long)hal + 0x3660);
  uVar24 = *(uint *)((long)hal + 0x3640);
  uVar23 = (ulong)uVar24;
  uVar26 = 0;
  if (-1 < (int)uVar24) {
    lVar22 = uVar23 + 1;
    puVar30 = puVar32;
    do {
      if (puVar30 != puVar7 && *(char *)((long)puVar30 + 0x27) != '\0') {
        *(undefined8 *)((long)hal + 0x3770) = puVar30[6];
        uVar2 = *puVar30;
        uVar3 = puVar30[1];
        uVar4 = puVar30[2];
        uVar9 = puVar30[3];
        uVar10 = puVar30[5];
        *(undefined8 *)((long)hal + 0x3760) = puVar30[4];
        *(undefined8 *)((long)hal + 0x3768) = uVar10;
        *(undefined8 *)((long)hal + 0x3750) = uVar4;
        *(undefined8 *)((long)hal + 0x3758) = uVar9;
        *puVar18 = uVar2;
        *(undefined8 *)((long)hal + 0x3748) = uVar3;
        uVar26 = 1;
        break;
      }
      puVar30 = puVar30 + 7;
      lVar22 = lVar22 + -1;
      uVar26 = 0;
    } while (lVar22 != 0);
  }
  if (-1 < (int)uVar24) {
    lVar22 = uVar23 + 1;
    puVar30 = puVar32;
    do {
      if (puVar30 != puVar7 && *(char *)((long)puVar30 + 0x29) != '\0') {
        uVar29 = (ulong)uVar26;
        uVar26 = uVar26 + 1;
        lVar22 = uVar29 * 0x38;
        *(undefined8 *)((long)hal + lVar22 + 0x3770) = puVar30[6];
        uVar2 = *puVar30;
        uVar3 = puVar30[1];
        uVar4 = puVar30[2];
        uVar9 = puVar30[3];
        uVar10 = puVar30[5];
        puVar1 = (undefined8 *)((long)hal + lVar22 + 0x3760);
        *puVar1 = puVar30[4];
        puVar1[1] = uVar10;
        puVar30 = (undefined8 *)((long)hal + lVar22 + 0x3750);
        *puVar30 = uVar4;
        puVar30[1] = uVar9;
        puVar18[uVar29 * 7] = uVar2;
        (puVar18 + uVar29 * 7)[1] = uVar3;
        break;
      }
      puVar30 = puVar30 + 7;
      lVar22 = lVar22 + -1;
    } while (lVar22 != 0);
  }
  if (-1 < (int)uVar24) {
    lVar22 = uVar23 + 1;
    puVar30 = puVar32;
    do {
      if (puVar30 != puVar7 && *(char *)(puVar30 + 5) != '\0') {
        lVar22 = (ulong)uVar26 * 0x38;
        *(undefined8 *)((long)hal + lVar22 + 0x3770) = puVar30[6];
        uVar2 = *puVar30;
        uVar3 = puVar30[1];
        uVar4 = puVar30[2];
        uVar9 = puVar30[3];
        uVar10 = puVar30[5];
        puVar7 = (undefined8 *)((long)hal + lVar22 + 0x3760);
        *puVar7 = puVar30[4];
        puVar7[1] = uVar10;
        puVar7 = (undefined8 *)((long)hal + lVar22 + 0x3750);
        *puVar7 = uVar4;
        puVar7[1] = uVar9;
        puVar18[(ulong)uVar26 * 7] = uVar2;
        (puVar18 + (ulong)uVar26 * 7)[1] = uVar3;
        break;
      }
      puVar30 = puVar30 + 7;
      lVar22 = lVar22 + -1;
    } while (lVar22 != 0);
  }
  if (0 < (int)uVar24) {
    lVar22 = 0;
    do {
      *(undefined2 *)((long)hal + lVar22 + 0x3767) = 0;
      *(undefined1 *)((long)hal + lVar22 + 0x3769) = 0;
      lVar22 = lVar22 + 0x38;
    } while (uVar23 * 0x38 - lVar22 != 0);
  }
  if (*(int *)((long)hal + 0x6924) == 1) {
    lVar22 = *(long *)((long)hal + 0x37e8);
    *(undefined1 *)(lVar22 + 0x25) = 1;
    *(undefined1 *)(lVar22 + 0x29) = 1;
    *(undefined2 *)(lVar22 + 0x27) = 0x101;
    *(undefined1 *)((long)hal + 0x376a) = 1;
    *(undefined1 *)((long)hal + 0x37a2) = 1;
    *(undefined1 *)((long)hal + 0x37da) = 1;
  }
  lVar22 = *(long *)((long)hal + 0x158);
  if (*(char *)(lVar22 + 2) == '\0') {
    return MPP_OK;
  }
  if ((*(int *)(lVar22 + 0x5c) != 0) &&
     (lVar40 = *(long *)((long)hal + 0x37e8), *(undefined1 *)(lVar40 + 0x29) = 1,
     *(char *)(lVar40 + 0x28) == '\0')) {
    *(undefined1 *)((long)hal + 0x37a0) = 1;
  }
  lVar40 = *(long *)((long)hal + 0x128);
  lVar28 = -0x10;
  do {
    *(undefined4 *)(lVar40 + 0x2c + lVar28) = *(undefined4 *)(lVar22 + 0x18);
    *(undefined4 *)(lVar40 + 0x3c + lVar28) = *(undefined4 *)((long)hal + 0xa8);
    lVar28 = lVar28 + 4;
  } while (lVar28 != 0);
  uVar24 = *(uint *)((long)hal + 0x3640);
  if ((long)(int)uVar24 < 2) {
    *(undefined1 *)(*(long *)((long)hal + 0x37e8) + 0x29) = 0;
  }
  if ((int)uVar24 < 3) {
    *(undefined1 *)(*(long *)((long)hal + 0x37e8) + 0x28) = 0;
  }
  if (0 < (int)uVar24) {
    lVar22 = *(long *)((long)hal + 0x37e8);
    lVar40 = 0;
    do {
      if (((int)uVar24 < 2) || (*(char *)(lVar22 + 0x29) != '\0')) {
        *(undefined1 *)((long)hal + lVar40 + 0x3769) = 0;
      }
      if (((int)uVar24 < 3) || (*(char *)(lVar22 + 0x28) != '\0')) {
        *(undefined1 *)((long)hal + lVar40 + 0x3768) = 0;
      }
      lVar40 = lVar40 + 0x38;
    } while ((ulong)uVar24 * 0x38 - lVar40 != 0);
  }
  pcVar31 = (char *)((long)hal + 0x376a);
  iVar12 = -1;
  lVar22 = 0;
  iVar37 = -1;
  do {
    if ((lVar22 < (int)uVar24) && (*pcVar31 != '\0')) {
      iVar39 = (int)lVar22;
      iVar27 = iVar12;
      if ((iVar37 != -1) && (pcVar36 = pcVar31, iVar39 = iVar37, iVar27 = (int)lVar22, iVar12 != -1)
         ) goto LAB_0026ce39;
    }
    else {
      pcVar36 = (char *)((long)puVar18 + lVar22 * 0x38 + 0x2a);
LAB_0026ce39:
      *pcVar36 = '\0';
      iVar39 = iVar37;
      iVar27 = iVar12;
    }
    iVar12 = iVar27;
    iVar37 = iVar39;
    lVar22 = lVar22 + 1;
    pcVar31 = pcVar31 + 0x38;
  } while (lVar22 != 3);
  iVar39 = 0;
  if (iVar37 != -1) {
    iVar39 = iVar37;
  }
  *(int *)((long)hal + 0x488) = iVar39;
  *(int *)((long)hal + 0x484) = iVar39;
  puVar7 = *(undefined8 **)((long)hal + 0x37e8);
  if (*(char *)((long)puVar7 + 0x25) != '\0') {
    lVar22 = (long)iVar39 * 0x38;
    *(undefined1 *)((long)hal + lVar22 + 0x376a) = 1;
    uVar5 = *(undefined4 *)((long)hal + lVar22 + 0x3750);
    *(undefined4 *)((long)hal + 0x1c4) = uVar5;
    uVar6 = *(undefined4 *)((long)hal + lVar22 + 0x3754);
    *(undefined4 *)((long)hal + 0x1cc) = uVar6;
    *(undefined4 *)((long)hal + 0x1c8) = uVar5;
    *(undefined4 *)((long)hal + 0x1d0) = uVar6;
    *(int *)((long)hal + 0x488) = iVar39;
    *(int *)((long)hal + 0x484) = iVar39;
    *(undefined4 *)((long)hal + 0x48c) = 0;
    if (iVar12 != -1) {
      *(undefined4 *)((long)hal + 0x1c8) = *(undefined4 *)((long)hal + (long)iVar12 * 0x38 + 0x3750)
      ;
      *(undefined4 *)((long)hal + 0x1d0) = *(undefined4 *)((long)hal + (long)iVar12 * 0x38 + 0x3754)
      ;
      *(int *)((long)hal + 0x488) = iVar12;
      *(undefined4 *)((long)hal + 0x48c) = 1;
    }
  }
  *(undefined4 *)((long)hal + 0x1b4) = 0;
  if (*(int *)(puVar7 + 2) == 0) {
    if ((int)uVar24 < 0) {
      uVar26 = 0xffffffff;
    }
    else {
      uVar23 = 0xffffffff;
      uVar29 = 0;
      do {
        if ((((puVar32 != puVar7) &&
             ((*(byte *)((long)puVar32 + 0x27) & ~*(byte *)((long)puVar7 + 0x27)) == 0)) &&
            ((*(byte *)((long)puVar32 + 0x29) & ~*(byte *)((long)puVar7 + 0x29)) == 0)) &&
           ((*(byte *)(puVar32 + 5) & ~*(byte *)(puVar7 + 5)) == 0)) {
          uVar23 = uVar29 & 0xffffffff;
        }
        uVar26 = (uint)uVar23;
        uVar29 = uVar29 + 1;
        puVar32 = puVar32 + 7;
      } while ((ulong)uVar24 + 1 != uVar29);
    }
    if ((int)uVar26 < 0) {
      *(undefined4 *)((long)hal + 0x1b4) = 1;
    }
    else {
      *(undefined4 *)(puVar7 + 2) = *(undefined4 *)((long)hal + (ulong)uVar26 * 0x38 + 0x3670);
      *(undefined4 *)((long)hal + (ulong)uVar26 * 0x38 + 0x3670) = 0;
    }
  }
  *(undefined4 *)((long)hal + 0x1bc) = *(undefined4 *)(puVar7 + 2);
  *(undefined4 *)((long)hal + 0x1c0) = *(undefined4 *)((long)puVar7 + 0x14);
  vp8e_init_entropy(hal);
  lVar22 = *(long *)((long)hal + 0x60);
  pcVar31 = *(char **)((long)hal + 0x128);
  iVar12 = *(int *)(*(long *)((long)hal + 0x158) + 0x18);
  if (*(int *)((long)hal + 0x36c) != 0) {
    iVar39 = iVar12 - *(int *)((long)hal + 0x36c);
    iVar37 = 0x7f;
    if (iVar39 < 0x7f) {
      iVar37 = iVar39;
    }
    iVar39 = 0;
    if (0 < iVar37) {
      iVar39 = iVar37;
    }
    *(int *)(pcVar31 + 0x20) = iVar39;
  }
  if (*(int *)((long)hal + 0x370) != 0) {
    iVar12 = iVar12 - *(int *)((long)hal + 0x370);
    iVar37 = 0x7f;
    if (iVar12 < 0x7f) {
      iVar37 = iVar12;
    }
    iVar12 = 0;
    if (0 < iVar37) {
      iVar12 = iVar37;
    }
    *(int *)(pcVar31 + 0x24) = iVar12;
  }
  buf = (RK_U32 *)mpp_buffer_get_ptr_with_caller(*(MppBuffer *)(lVar22 + 0x40),"set_segmentation");
  uVar24 = *(int *)((long)hal + 0x6928) + 0xfU >> 1 & 0xfffffff8;
  RVar38 = 0;
  mpp_buffer_sync_begin_f(*(MppBuffer *)(lVar22 + 0x40),0,"set_segmentation");
  if ((*(int *)((long)hal + 0x36c) == 0) && (*(int *)((long)hal + 0x370) == 0)) {
    if ((pcVar31[0x18] != '\0') && (*pcVar31 != '\0')) {
      *(undefined1 (*) [16])(pcVar31 + 4) = (undefined1  [16])0x0;
      if (uVar24 != 0) {
        uVar26 = 0;
        uVar23 = 0;
        do {
          uVar34 = buf[uVar23];
          iVar12 = 0x1c;
          uVar35 = uVar26;
          do {
            if (uVar35 < *(uint *)((long)hal + 0x6928)) {
              *(int *)(pcVar31 + (ulong)(uVar34 >> ((byte)iVar12 & 0x1f) & 0xf) * 4 + 4) =
                   *(int *)(pcVar31 + (ulong)(uVar34 >> ((byte)iVar12 & 0x1f) & 0xf) * 4 + 4) + 1;
            }
            iVar12 = iVar12 + -4;
            uVar35 = uVar35 + 1;
          } while (iVar12 != -4);
          uVar23 = uVar23 + 1;
          uVar26 = uVar26 + 8;
        } while (uVar23 != (uVar24 >> 2) + (uint)(uVar24 >> 2 == 0));
      }
      goto LAB_0026d130;
    }
  }
  else {
    pcVar31[0x18] = '\x01';
    *(undefined1 (*) [16])(pcVar31 + 4) = (undefined1  [16])0x0;
    pRVar19 = buf;
    if (*(int *)((long)hal + 0x6930) != 0) {
      uVar26 = 0;
      RVar38 = 0;
      iVar12 = 0;
      do {
        if (*(int *)((long)hal + 0x692c) != 0) {
          uVar34 = 0;
          do {
            uVar23 = 0;
            if (((*(uint *)((long)hal + 0x350) <= uVar34) &&
                (uVar34 <= *(uint *)((long)hal + 0x358))) &&
               (*(uint *)((long)hal + 0x34c) <= uVar26)) {
              uVar23 = (ulong)(uVar26 <= *(uint *)((long)hal + 0x354));
            }
            if ((((*(uint *)((long)hal + 0x350) <= uVar34) &&
                 (uVar34 <= *(uint *)((long)hal + 0x368))) &&
                (*(uint *)((long)hal + 0x35c) <= uVar26)) &&
               (uVar26 <= *(uint *)((long)hal + 0x364))) {
              uVar23 = 2;
            }
            *(int *)(pcVar31 + uVar23 * 4 + 4) = *(int *)(pcVar31 + uVar23 * 4 + 4) + 1;
            uVar35 = iVar12 + uVar34 & 7;
            RVar38 = RVar38 | (int)uVar23 << ((char)uVar35 * '\x04' ^ 0x1cU);
            if (uVar35 == 7) {
              *pRVar19 = RVar38;
              pRVar19 = pRVar19 + 1;
              RVar38 = 0;
            }
            uVar34 = uVar34 + 1;
          } while (uVar34 < *(uint *)((long)hal + 0x692c));
          iVar12 = iVar12 + uVar34;
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 < *(uint *)((long)hal + 0x6930));
    }
    *pRVar19 = RVar38;
LAB_0026d130:
    vp8e_swap_endian(buf,uVar24);
  }
  mpp_buffer_sync_end_f(*(MppBuffer *)(lVar22 + 0x40),0,"set_segmentation");
  lVar22 = *(long *)((long)hal + 0x37e8);
  if ((*(char *)(lVar22 + 0x24) == '\0') && (pcVar31[0x18] != '\0')) {
    *(undefined8 *)((long)hal + 0x130) = *(undefined8 *)((long)hal + 0x128);
  }
  else {
    *(undefined4 *)((long)hal + 0x148) = 0xffffffff;
    *(undefined4 *)((long)hal + 0x14c) = 0xffffffff;
    *(undefined4 *)((long)hal + 0x150) = 0xffffffff;
    *(undefined4 *)((long)hal + 0x154) = 0xffffffff;
    *(undefined4 *)((long)hal + 0x138) = 0xffffffff;
    *(undefined4 *)((long)hal + 0x13c) = 0xffffffff;
    *(undefined4 *)((long)hal + 0x140) = 0xffffffff;
    *(undefined4 *)((long)hal + 0x144) = 0xffffffff;
    *(undefined8 *)((long)hal + 0x130) = 0;
  }
  if (*(int *)((long)hal + 0xc4) != 0) {
    lVar40 = *(long *)((long)hal + 0x128);
    if (*(int *)((long)hal + 0x6924) == 0) {
      *(undefined4 *)((long)hal + 0xa8) = 0x1a;
      iVar12 = *(int *)(lVar40 + 0x1c);
      iVar37 = *(int *)(lVar40 + 0x20);
      iVar39 = iVar12 / 2 + 8;
      if (0x6f < iVar12) {
        iVar39 = 0x3f;
      }
      if (iVar12 < -0x11) {
        iVar39 = 0;
      }
      iVar12 = iVar37 / 2 + 8;
      if (0x6f < iVar37) {
        iVar12 = 0x3f;
      }
      if (iVar37 < -0x11) {
        iVar12 = 0;
      }
      *(int *)(lVar40 + 0x2c) = iVar39;
      *(int *)(lVar40 + 0x30) = iVar12;
      iVar12 = *(int *)(lVar40 + 0x24);
      RVar13 = iVar12 / 2 + 8;
      if (0x6f < iVar12) {
        RVar13 = 0x3f;
      }
      if (iVar12 < -0x11) {
        RVar13 = 0;
      }
      *(RK_S32 *)(lVar40 + 0x34) = RVar13;
      iVar12 = *(int *)(lVar40 + 0x28);
      RVar13 = iVar12 / 2 + 8;
      if (0x6f < iVar12) {
        RVar13 = 0x3f;
      }
      if (iVar12 < -0x11) {
        RVar13 = 0;
      }
    }
    else {
      *(RK_S32 *)((long)hal + 0xa8) = 0xc;
      *(RK_S32 *)(lVar40 + 0x2c) = inter_level_tbl[*(int *)(lVar40 + 0x1c)];
      *(RK_S32 *)(lVar40 + 0x30) = inter_level_tbl[*(int *)(lVar40 + 0x20)];
      *(RK_S32 *)(lVar40 + 0x34) = inter_level_tbl[*(int *)(lVar40 + 0x24)];
      RVar13 = inter_level_tbl[*(int *)(lVar40 + 0x28)];
    }
    *(RK_S32 *)(lVar40 + 0x38) = RVar13;
  }
  if (*(int *)((long)hal + 200) != 0) {
    *(undefined4 *)((long)hal + 0xac) = 0;
  }
  if (*(char *)((long)hal + 0xcc) != '\0') {
    if (*(char *)((long)hal + 0xcc) == '\x02') {
      *(undefined1 *)((long)hal + 0xcc) = 1;
    }
    else if (*(int *)((long)hal + 0xa8) == 0) {
      *(undefined1 (*) [16])((long)hal + 0xd0) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)hal + 0xf0) = (undefined1  [16])0x0;
    }
    else if (((*(char *)(lVar22 + 0x27) == '\0') && (*(char *)(lVar22 + 0x29) == '\0')) &&
            (*(char *)(lVar22 + 0x28) == '\0')) {
      *(undefined8 *)((long)hal + 0xf0) = *(undefined8 *)((long)hal + 0x100);
      *(undefined8 *)((long)hal + 0xf8) = *(undefined8 *)((long)hal + 0x108);
      *(undefined8 *)((long)hal + 0xd0) = *(undefined8 *)((long)hal + 0xe0);
      *(undefined8 *)((long)hal + 0xd8) = *(undefined8 *)((long)hal + 0xe8);
    }
    else {
      *(undefined8 *)((long)hal + 0xf0) = 2;
      *(undefined8 *)((long)hal + 0xf8) = 0xfffffffefffffffe;
      *(undefined8 *)((long)hal + 0xd0) = 0xfffffffe00000004;
      *(undefined8 *)((long)hal + 0xd8) = 0x400000002;
      lVar40 = 0;
      do {
        iVar12 = *(int *)((long)hal + lVar40 * 4 + 0xf0);
        if (0x3e < iVar12) {
          iVar12 = 0x3f;
        }
        if (iVar12 < -0x3e) {
          iVar12 = -0x3f;
        }
        iVar37 = *(int *)((long)hal + lVar40 * 4 + 0xd0);
        if (0x3e < iVar37) {
          iVar37 = 0x3f;
        }
        if (iVar37 < -0x3e) {
          iVar37 = -0x3f;
        }
        *(int *)((long)hal + lVar40 * 4 + 0xf0) = iVar12;
        *(int *)((long)hal + lVar40 * 4 + 0xd0) = iVar37;
        lVar40 = lVar40 + 1;
      } while (lVar40 != 4);
    }
  }
  lVar40 = *(long *)((long)hal + 0x128);
  if (*(char *)(lVar22 + 0x24) != '\0') {
    vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0x90),1);
    vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0x94),1);
  }
  vp8e_put_lit(bitbuf,(uint)*(byte *)(lVar40 + 0x18),1);
  if (*(char *)(lVar40 + 0x18) != '\0') {
    pbVar8 = *(byte **)((long)hal + 0x128);
    uVar2 = *(undefined8 *)((long)hal + 0x140);
    uVar3 = *(undefined8 *)((long)hal + 0x138);
    uVar4 = *(undefined8 *)(pbVar8 + 0x24);
    auVar43[0] = -((char)*(undefined8 *)(pbVar8 + 0x1c) == (char)uVar3);
    auVar43[1] = -((char)((ulong)*(undefined8 *)(pbVar8 + 0x1c) >> 8) == (char)((ulong)uVar3 >> 8));
    auVar43[2] = -(pbVar8[0x1e] == (byte)((ulong)uVar3 >> 0x10));
    auVar43[3] = -(pbVar8[0x1f] == (byte)((ulong)uVar3 >> 0x18));
    auVar43[4] = -(pbVar8[0x20] == (byte)((ulong)uVar3 >> 0x20));
    auVar43[5] = -(pbVar8[0x21] == (byte)((ulong)uVar3 >> 0x28));
    auVar43[6] = -(pbVar8[0x22] == (byte)((ulong)uVar3 >> 0x30));
    auVar43[7] = -(pbVar8[0x23] == (byte)((ulong)uVar3 >> 0x38));
    auVar43[8] = -(pbVar8[0x24] == (byte)uVar2);
    auVar43[9] = -((char)((ulong)uVar4 >> 8) == (char)((ulong)uVar2 >> 8));
    auVar43[10] = -((char)((ulong)uVar4 >> 0x10) == (char)((ulong)uVar2 >> 0x10));
    auVar43[0xb] = -((char)((ulong)uVar4 >> 0x18) == (char)((ulong)uVar2 >> 0x18));
    auVar43[0xc] = -((char)((ulong)uVar4 >> 0x20) == (char)((ulong)uVar2 >> 0x20));
    auVar43[0xd] = -((char)((ulong)uVar4 >> 0x28) == (char)((ulong)uVar2 >> 0x28));
    auVar43[0xe] = -((char)((ulong)uVar4 >> 0x30) == (char)((ulong)uVar2 >> 0x30));
    auVar43[0xf] = -((char)((ulong)uVar4 >> 0x38) == (char)((ulong)uVar2 >> 0x38));
    auVar42[0] = -(pbVar8[0x2c] == *(byte *)((long)hal + 0x148));
    auVar42[1] = -(pbVar8[0x2d] == *(byte *)((long)hal + 0x149));
    auVar42[2] = -(pbVar8[0x2e] == *(byte *)((long)hal + 0x14a));
    auVar42[3] = -(pbVar8[0x2f] == *(byte *)((long)hal + 0x14b));
    auVar42[4] = -(pbVar8[0x30] == *(byte *)((long)hal + 0x14c));
    auVar42[5] = -(pbVar8[0x31] == *(byte *)((long)hal + 0x14d));
    auVar42[6] = -(pbVar8[0x32] == *(byte *)((long)hal + 0x14e));
    auVar42[7] = -(pbVar8[0x33] == *(byte *)((long)hal + 0x14f));
    auVar42[8] = -(pbVar8[0x34] == *(byte *)((long)hal + 0x150));
    auVar42[9] = -(pbVar8[0x35] == *(byte *)((long)hal + 0x151));
    auVar42[10] = -(pbVar8[0x36] == *(byte *)((long)hal + 0x152));
    auVar42[0xb] = -(pbVar8[0x37] == *(byte *)((long)hal + 0x153));
    auVar42[0xc] = -(pbVar8[0x38] == *(byte *)((long)hal + 0x154));
    auVar42[0xd] = -(pbVar8[0x39] == *(byte *)((long)hal + 0x155));
    auVar42[0xe] = -(pbVar8[0x3a] == *(byte *)((long)hal + 0x156));
    auVar42[0xf] = -(pbVar8[0x3b] == *(byte *)((long)hal + 0x157));
    auVar42 = auVar42 & auVar43;
    bVar41 = (ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar42[0xf] >> 7) << 0xf) != 0xffff;
    if (*(long *)((long)hal + 0x130) == 0) {
      *pbVar8 = 1;
    }
    vp8e_put_lit(bitbuf,(uint)*pbVar8,1);
    vp8e_put_lit(bitbuf,(uint)bVar41,1);
    if (bVar41) {
      vp8e_put_lit(bitbuf,1,1);
      lVar40 = 0;
      do {
        uVar24 = *(uint *)(pbVar8 + 0x1c + lVar40 * 4);
        vp8e_put_lit(bitbuf,1,1);
        uVar26 = -uVar24;
        if (0 < (int)uVar24) {
          uVar26 = uVar24;
        }
        vp8e_put_lit(bitbuf,uVar26,7);
        vp8e_put_lit(bitbuf,uVar24 >> 0x1f,1);
        lVar40 = lVar40 + 1;
      } while (lVar40 != 4);
      lVar40 = 0;
      do {
        uVar24 = *(uint *)(pbVar8 + 0x2c + lVar40 * 4);
        vp8e_put_lit(bitbuf,1,1);
        uVar26 = -uVar24;
        if (0 < (int)uVar24) {
          uVar26 = uVar24;
        }
        vp8e_put_lit(bitbuf,uVar26,6);
        vp8e_put_lit(bitbuf,uVar24 >> 0x1f,1);
        lVar40 = lVar40 + 1;
      } while (lVar40 != 4);
    }
    if (*pbVar8 != 0) {
      iVar27 = *(int *)(pbVar8 + 8) + *(int *)(pbVar8 + 4);
      iVar39 = *(int *)(pbVar8 + 0x10) + *(int *)(pbVar8 + 0xc);
      iVar12 = (iVar27 * 0xff) / (iVar39 + iVar27);
      iVar37 = 0xff;
      if (0xfe < iVar12) {
        iVar12 = 0xff;
      }
      if (iVar12 < 2) {
        iVar12 = 1;
      }
      *(int *)((long)hal + 0x3630) = iVar12;
      iVar12 = 0xff;
      if (iVar27 != 0) {
        iVar12 = (*(int *)(pbVar8 + 4) * 0xff) / iVar27;
      }
      if (0xfe < iVar12) {
        iVar12 = 0xff;
      }
      iVar27 = 1;
      if (1 < iVar12) {
        iVar27 = iVar12;
      }
      *(int *)((long)hal + 0x3634) = iVar27;
      if (iVar39 != 0) {
        iVar37 = (*(int *)(pbVar8 + 0xc) * 0xff) / iVar39;
      }
      iVar12 = 0xff;
      if (iVar37 < 0xff) {
        iVar12 = iVar37;
      }
      if (iVar12 < 2) {
        iVar12 = 1;
      }
      *(int *)((long)hal + 0x3638) = iVar12;
      lVar40 = 0;
      do {
        if (*(int *)(pbVar8 + lVar40 * 4 + 4) == 0) {
          RVar13 = 0;
          RVar14 = 1;
        }
        else {
          vp8e_put_lit(bitbuf,1,1);
          RVar13 = *(RK_S32 *)((long)hal + lVar40 * 4 + 0x3630);
          RVar14 = 8;
        }
        vp8e_put_lit(bitbuf,RVar13,RVar14);
        lVar40 = lVar40 + 1;
      } while (lVar40 != 3);
    }
    uVar2 = *(undefined8 *)(pbVar8 + 0x24);
    *(undefined8 *)((long)hal + 0x138) = *(undefined8 *)(pbVar8 + 0x1c);
    *(undefined8 *)((long)hal + 0x140) = uVar2;
    uVar2 = *(undefined8 *)(pbVar8 + 0x34);
    *(undefined8 *)((long)hal + 0x148) = *(undefined8 *)(pbVar8 + 0x2c);
    *(undefined8 *)((long)hal + 0x150) = uVar2;
  }
  vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0xa4),1);
  vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0xa8),6);
  vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0xac),3);
  vp8e_put_lit(bitbuf,(uint)*(byte *)((long)hal + 0xcc),1);
  if (*(char *)((long)hal + 0xcc) != '\0') {
    if (*(char *)(lVar22 + 0x24) != '\0') {
      *(undefined1 (*) [16])((long)hal + 0x100) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)hal + 0xe0) = (undefined1  [16])0x0;
    }
    lVar40 = 0;
    bVar21 = 0;
    do {
      iVar12 = *(int *)((long)hal + lVar40 * 4 + 0xd0);
      iVar37 = *(int *)((long)hal + lVar40 * 4 + 0xe0);
      auStack_78[lVar40] = (uint)(iVar12 != iVar37);
      bVar41 = *(int *)((long)hal + lVar40 * 4 + 0xf0) != *(int *)((long)hal + 0x100 + lVar40 * 4);
      if (bVar41) {
        bVar21 = 1;
      }
      auStack_88[lVar40] = (uint)bVar41;
      if (iVar12 != iVar37) {
        bVar21 = 1;
      }
      lVar40 = lVar40 + 1;
    } while (lVar40 != 4);
    if (*(int *)((long)hal + 0x110) == 0) {
      bVar21 = 1;
    }
    vp8e_put_lit(bitbuf,(uint)bVar21,1);
    if (bVar21 != 0) {
      lVar40 = 0;
      do {
        uVar24 = auStack_88[lVar40];
        vp8e_put_lit(bitbuf,uVar24,1);
        if (uVar24 != 0) {
          uVar24 = *(uint *)((long)hal + 0xf0 + lVar40 * 4);
          uVar26 = -uVar24;
          if (0 < (int)uVar24) {
            uVar26 = uVar24;
          }
          vp8e_put_lit(bitbuf,uVar26,6);
          vp8e_put_lit(bitbuf,uVar24 >> 0x1f,1);
        }
        lVar40 = lVar40 + 1;
      } while (lVar40 != 4);
      lVar40 = 0;
      do {
        uVar24 = auStack_78[lVar40];
        vp8e_put_lit(bitbuf,uVar24,1);
        if (uVar24 != 0) {
          uVar24 = *(uint *)((long)hal + 0xd0 + lVar40 * 4);
          uVar26 = -uVar24;
          if (0 < (int)uVar24) {
            uVar26 = uVar24;
          }
          vp8e_put_lit(bitbuf,uVar26,6);
          vp8e_put_lit(bitbuf,uVar24 >> 0x1f,1);
        }
        lVar40 = lVar40 + 1;
      } while (lVar40 != 4);
      *(undefined8 *)((long)hal + 0x100) = *(undefined8 *)((long)hal + 0xf0);
      *(undefined8 *)((long)hal + 0x108) = *(undefined8 *)((long)hal + 0xf8);
      *(undefined8 *)((long)hal + 0xe0) = *(undefined8 *)((long)hal + 0xd0);
      *(undefined8 *)((long)hal + 0xe8) = *(undefined8 *)((long)hal + 0xd8);
    }
  }
  vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0x98),2);
  vp8e_put_lit(bitbuf,*(RK_S32 *)(*(long *)((long)hal + 0x158) + 0x18),7);
  vp8e_put_lit(bitbuf,0,1);
  vp8e_put_lit(bitbuf,0,1);
  vp8e_put_lit(bitbuf,0,1);
  vp8e_put_lit(bitbuf,0,1);
  vp8e_put_lit(bitbuf,0,1);
  if (*(char *)(lVar22 + 0x24) == '\0') {
    iVar12 = 1;
    vp8e_put_lit(bitbuf,(uint)*(byte *)(lVar22 + 0x29),1);
    vp8e_put_lit(bitbuf,(uint)*(byte *)(lVar22 + 0x28),1);
    if (*(char *)(lVar22 + 0x29) == '\0') {
      if (*(char *)((long)hal + 0x3769) == '\0') {
        iVar12 = (uint)(*(char *)((long)hal + 0x37d9) != '\0') * 2;
      }
      vp8e_put_lit(bitbuf,iVar12,2);
    }
    if (*(char *)(lVar22 + 0x28) == '\0') {
      iVar12 = 1;
      if (*(char *)((long)hal + 0x3768) == '\0') {
        iVar12 = (uint)(*(char *)((long)hal + 0x37a0) != '\0') * 2;
      }
      vp8e_put_lit(bitbuf,iVar12,2);
    }
    vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0xbc),1);
    vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0xc0),1);
  }
  vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0x110),1);
  if (*(char *)(lVar22 + 0x24) == '\0') {
    vp8e_put_lit(bitbuf,(uint)*(byte *)(lVar22 + 0x27),1);
  }
  vp8e_calc_coeff_prob
            (bitbuf,(RK_S32 (*) [4] [8] [3] [11])((long)hal + 0x13a0),
             (RK_S32 (*) [4] [8] [3] [11])((long)hal + 0x2420));
  vp8e_put_lit(bitbuf,1,1);
  vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0x524),8);
  if (*(char *)(lVar22 + 0x24) == '\0') {
    vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0x528),8);
    vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0x52c),8);
    vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0x530),8);
    vp8e_put_lit(bitbuf,0,1);
    vp8e_put_lit(bitbuf,0,1);
    vp8e_calc_mv_prob(bitbuf,(RK_S32 (*) [2] [19])((long)hal + 0x34b0),
                      (RK_S32 (*) [2] [19])((long)hal + 0x3548));
  }
  lVar22 = *(long *)((long)hal + 0x60);
  *(uint *)((long)hal + 0x19c) = *(uint *)((long)hal + 0x19c) >> 3 & 0xfffffff8;
  uVar24 = *(int *)((long)hal + 0x198) + *(int *)((long)hal + 0x3834);
  *(uint *)((long)hal + 0x198) = uVar24;
  uVar24 = uVar24 & 7;
  *(uint *)((long)hal + 0x1a0) = uVar24 << 3;
  if (uVar24 == 0) {
    *(undefined4 *)((long)hal + 0x1a8) = 0;
    uVar24 = 0;
    lVar40 = 0x1a4;
  }
  else {
    puVar20 = (uint *)((ulong)bitbuf->data & 0xfffffffffffffff8);
    bVar41 = true;
    if (uVar24 != 7) {
      uVar24 = 6;
      do {
        *(undefined1 *)((long)puVar20 + (ulong)uVar24) = 0;
        uVar24 = uVar24 - 1;
      } while (*(uint *)((long)hal + 0x1a0) >> 3 <= uVar24);
      bVar41 = 0x20 < *(uint *)((long)hal + 0x1a0);
    }
    uVar24 = *puVar20;
    *(uint *)((long)hal + 0x1a4) =
         uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8 | uVar24 << 0x18;
    uVar24 = 0;
    lVar40 = 0x1a8;
    if (bVar41) {
      uVar24 = (uint)*(byte *)((long)puVar20 + 6) << 8 |
               (uint)*(byte *)((long)puVar20 + 5) << 0x10 | puVar20[1] << 0x18;
    }
  }
  *(uint *)((long)hal + lVar40) = uVar24;
  if (*(int *)((long)hal + 0xb0) == 1) {
    if (*(uint *)((long)hal + 0x6928) < 0x1fe1) goto LAB_0026db61;
LAB_0026db49:
    *(undefined4 *)((long)hal + 0x300) = 1;
  }
  else {
    if (*(int *)((long)hal + 0xb0) == 0) goto LAB_0026db49;
LAB_0026db61:
    *(undefined4 *)((long)hal + 0x300) = 0;
  }
  *(undefined4 *)((long)hal + 0x188) = 1;
  if (*(int *)((long)hal + 0xb4) == 1) {
    if (*(uint *)((long)hal + 0x6928) < 0x631) goto LAB_0026db9c;
  }
  else if (*(int *)((long)hal + 0xb4) != 0) {
LAB_0026db9c:
    *(undefined4 *)((long)hal + 0x4f0) = 1;
    goto LAB_0026dba6;
  }
  *(undefined4 *)((long)hal + 0x4f0) = 0;
LAB_0026dba6:
  uVar24 = *(uint *)(*(long *)((long)hal + 0x158) + 0x18);
  if (*(int *)((long)hal + 0x318) == -1) {
    if (*(int *)((long)hal + 0x528) < 0x81) {
      iVar12 = 0x28;
      if (0x28 < (int)(uVar24 * 2)) {
        iVar12 = uVar24 * 2;
      }
      uVar26 = iVar12 - 0x28;
    }
    else {
      uVar26 = 0x80U - *(int *)((long)hal + 0x528) & 0xffff;
    }
    *(uint *)((long)hal + 0x318) = uVar26;
  }
  if (*(int *)((long)hal + 0x324) == -1) {
    *(undefined4 *)((long)hal + 0x324) = 0x20;
  }
  if (*(int *)((long)hal + 0x328) == -1) {
    *(undefined4 *)((long)hal + 0x328) = 0x3c0;
  }
  if (*(int *)((long)hal + 0x32c) == -1) {
    *(undefined4 *)((long)hal + 0x32c) = 8;
  }
  if (*(int *)((long)hal + 0x31c) == -1) {
    uVar26 = 0;
    if (99 < (int)uVar24) {
      uVar26 = uVar24 * 3 >> 2;
    }
    *(uint *)((long)hal + 0x31c) = uVar26;
  }
  if (*(int *)((long)hal + 800) == -1) {
    iVar12 = (uVar24 - 10) + (uVar24 >> 2);
    if ((int)uVar24 < 8) {
      iVar12 = 0;
    }
    *(int *)((long)hal + 800) = iVar12;
  }
  if (*(int *)((long)hal + 0x4f4) == 0) {
    iVar12 = 0x3ff;
    if (vp8_split_penalty_tbl[(int)uVar24] < 0x7fe) {
      iVar12 = vp8_split_penalty_tbl[(int)uVar24] / 2;
    }
    *(int *)((long)hal + 0x4f4) = iVar12;
  }
  if (*(int *)((long)hal + 0x4f8) == 0) {
    iVar12 = vp8_split_penalty_tbl[(int)uVar24];
    iVar37 = 0x3ff;
    if (iVar12 < 0x7ea) {
      iVar39 = iVar12 * 2 + 0x28;
      iVar37 = iVar12 * 2 + 0x2b;
      if (-1 < iVar39) {
        iVar37 = iVar39;
      }
      iVar37 = iVar37 >> 2;
    }
    *(int *)((long)hal + 0x4f8) = iVar37;
  }
  if (*(int *)((long)hal + 0x500) == 0) {
    iVar12 = vp8_split_penalty_tbl[(int)uVar24];
    iVar37 = 0x1ff;
    if (iVar12 < 0x3c0) {
      iVar39 = iVar12 * 8 + 500;
      iVar37 = iVar12 * 8 + 0x203;
      if (-1 < iVar39) {
        iVar37 = iVar39;
      }
      iVar37 = iVar37 >> 4;
    }
    *(int *)((long)hal + 0x500) = iVar37;
  }
  puVar25 = (undefined1 *)((long)hal + 0x278);
  lVar40 = 0;
  do {
    puVar25[-0x80] = (char)lVar40;
    RVar13 = vp8e_calc_cost_mv((RK_S32)lVar40,(RK_S32 *)((long)hal + 0x34b0));
    RVar14 = vp8e_calc_cost_mv((RK_S32)lVar40,(RK_S32 *)((long)hal + 0x34fc));
    iVar12 = (((RVar13 + RVar14) - (RVar14 + RVar13 + 1 >> 0x1f)) + 1 >> 1) *
             weight_tbl[(int)uVar24];
    uVar11 = (undefined1)((uint)iVar12 >> 8);
    if (0xfe < iVar12 >> 8) {
      uVar11 = 0xff;
    }
    *puVar25 = uVar11;
    lVar40 = lVar40 + 2;
    puVar25 = puVar25 + 1;
  } while (lVar40 != 0x100);
  lVar40 = *(long *)((long)hal + 0x128);
  lVar28 = 0;
  do {
    uVar24 = *(uint *)(lVar40 + 0x1c + lVar28 * 4);
    lVar33 = (long)(int)uVar24 * 0x20;
    *(undefined2 *)((long)hal + lVar28 * 2 + 0x3d4) = *(undefined2 *)((long)hal + lVar33 + 0x3898);
    *(undefined2 *)((long)hal + lVar28 * 2 + 0x3dc) = *(undefined2 *)((long)hal + lVar33 + 0x389c);
    *(undefined2 *)((long)hal + lVar28 * 2 + 0x3e4) = *(undefined2 *)((long)hal + lVar33 + 0x4898);
    *(undefined2 *)((long)hal + lVar28 * 2 + 0x3ec) = *(undefined2 *)((long)hal + lVar33 + 0x489c);
    *(undefined2 *)((long)hal + lVar28 * 2 + 0x3f4) = *(undefined2 *)((long)hal + lVar33 + 0x5898);
    *(undefined2 *)((long)hal + lVar28 * 2 + 0x3fc) = *(undefined2 *)((long)hal + lVar33 + 0x589c);
    *(undefined2 *)((long)hal + lVar28 * 2 + 0x404) = *(undefined2 *)((long)hal + lVar33 + 0x38a0);
    *(undefined2 *)((long)hal + lVar28 * 2 + 0x40c) = *(undefined2 *)((long)hal + lVar33 + 0x38a4);
    *(undefined2 *)((long)hal + lVar28 * 2 + 0x414) = *(undefined2 *)((long)hal + lVar33 + 0x48a0);
    *(undefined2 *)((long)hal + lVar28 * 2 + 0x41c) = *(undefined2 *)((long)hal + lVar33 + 0x48a4);
    *(undefined2 *)((long)hal + lVar28 * 2 + 0x424) = *(undefined2 *)((long)hal + lVar33 + 0x58a0);
    *(undefined2 *)((long)hal + lVar28 * 2 + 0x42c) = *(undefined2 *)((long)hal + lVar33 + 0x58a4);
    *(undefined1 *)((long)hal + lVar28 + 0x434) = *(undefined1 *)((long)hal + lVar33 + 0x38a8);
    *(undefined1 *)((long)hal + lVar28 + 0x438) = *(undefined1 *)((long)hal + lVar33 + 0x38ac);
    *(undefined1 *)((long)hal + lVar28 + 0x43c) = *(undefined1 *)((long)hal + lVar33 + 0x48a8);
    *(undefined1 *)((long)hal + lVar28 + 0x440) = *(undefined1 *)((long)hal + lVar33 + 0x48ac);
    *(undefined1 *)((long)hal + lVar28 + 0x444) = *(undefined1 *)((long)hal + lVar33 + 0x58a8);
    *(undefined1 *)((long)hal + lVar28 + 0x448) = *(undefined1 *)((long)hal + lVar33 + 0x58ac);
    *(undefined2 *)((long)hal + lVar28 * 2 + 0x44c) = *(undefined2 *)((long)hal + lVar33 + 0x38b0);
    *(undefined2 *)((long)hal + lVar28 * 2 + 0x454) = *(undefined2 *)((long)hal + lVar33 + 0x38b4);
    *(undefined2 *)((long)hal + lVar28 * 2 + 0x45c) = *(undefined2 *)((long)hal + lVar33 + 0x48b0);
    *(undefined2 *)((long)hal + lVar28 * 2 + 0x464) = *(undefined2 *)((long)hal + lVar33 + 0x48b4);
    *(undefined2 *)((long)hal + lVar28 * 2 + 0x46c) = *(undefined2 *)((long)hal + lVar33 + 0x58b0);
    *(undefined2 *)((long)hal + lVar28 * 2 + 0x474) = *(undefined2 *)((long)hal + lVar33 + 0x58b4);
    *(undefined4 *)((long)hal + lVar28 * 4 + 0x4a0) = *(undefined4 *)(lVar40 + 0x2c + lVar28 * 4);
    lVar28 = lVar28 + 1;
  } while (lVar28 != 4);
  *(undefined4 *)((long)hal + 0x490) = *(undefined4 *)((long)hal + 0x383c);
  *(int *)((long)hal + 0x494) = 0x18 - *(int *)((long)hal + 0x3840);
  *(undefined4 *)((long)hal + 0x498) = *(undefined4 *)((long)hal + 0x3838);
  *(uint *)((long)hal + 0x170) = (uint)(*(char *)(*(long *)((long)hal + 0x37e8) + 0x24) != '\0');
  iVar12 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar22 + 0x38),"set_new_frame");
  *(int *)((long)hal + 0x1ac) = iVar12;
  *(undefined4 *)((long)hal + 0x49c) = *(undefined4 *)((long)hal + 0x98);
  *(undefined4 *)((long)hal + 0x184) = *(undefined4 *)((long)hal + 0xa4);
  *(undefined4 *)((long)hal + 0x4b0) = *(undefined4 *)((long)hal + 0xac);
  pbVar8 = *(byte **)((long)hal + 0x128);
  *(uint *)((long)hal + 0x47c) = (uint)pbVar8[0x18];
  *(uint *)((long)hal + 0x480) = (uint)*pbVar8;
  *pbVar8 = 0;
  lVar40 = 0x145;
  do {
    *(undefined4 *)((long)hal + lVar40 * 4 + -0x10) =
         *(undefined4 *)((long)hal + lVar40 * 4 + -0x424);
    *(undefined4 *)((long)hal + lVar40 * 4) = *(undefined4 *)((long)hal + lVar40 * 4 + -0x444);
    lVar40 = lVar40 + 1;
  } while (lVar40 != 0x149);
  lVar40 = 0;
  do {
    *(int *)((long)hal + lVar40 * 4 + 0x4c4) =
         (int)(intra4_mode_tree_penalty_tbl[lVar40] * (uVar24 * 2 + 8)) >> 8;
    lVar40 = lVar40 + 1;
  } while (lVar40 != 10);
  lVar40 = 0;
  do {
    *(int *)((long)hal + lVar40 * 4 + 0x4b4) =
         (int)(intra16_mode_tree_penalty_tbl[lVar40] * (uVar24 * 2 + 0x40)) >> 8;
    lVar40 = lVar40 + 1;
  } while (lVar40 != 4);
  if (*(int *)((long)hal + 0x310) == -1) {
    *(uint *)((long)hal + 0x310) = (uVar24 & 0x3fffff) << 3;
  }
  pvVar17 = mpp_buffer_get_ptr_with_caller(*(MppBuffer *)(lVar22 + 0x48),"set_new_frame");
  memset(pvVar17,0,0x1e8);
  mpp_buffer_sync_end_f(*(MppBuffer *)(lVar22 + 0x48),0,"set_new_frame");
  vp8e_write_entropy_tables(hal);
  return MPP_OK;
}

Assistant:

MPP_RET hal_vp8e_enc_strm_code(void *hal, HalEncTask *task)
{
    HalVp8eCtx  *ctx  = (HalVp8eCtx *)hal;
    Vp8eHwCfg *hw_cfg = &ctx->hw_cfg;
    VepuOffsetCfg hw_offset;

    MppEncCfgSet  *cfg = ctx->cfg;
    MppEncPrepCfg *prep = &cfg->prep;

    {
        RK_U32 i = 0;
        for (i = 0; i < 9; i++) {
            ctx->p_out_buf[i] = NULL;
            ctx->stream_size[i] = 0;
        }
    }

    {
        hw_offset.fmt = prep->format;

        hw_offset.width = prep->width;
        hw_offset.height = prep->height;
        hw_offset.hor_stride = prep->hor_stride;
        hw_offset.ver_stride = prep->ver_stride;
        hw_offset.offset_x = mpp_frame_get_offset_x(task->frame);
        hw_offset.offset_y = mpp_frame_get_offset_y(task->frame);

        get_vepu_offset_cfg(&hw_offset);
    }

    {
        HalEncTask *enc_task = task;

        hw_cfg->input_lum_base = mpp_buffer_get_fd(enc_task->input);
        hw_cfg->input_cb_base  = hw_cfg->input_lum_base;
        hw_cfg->input_cr_base  = hw_cfg->input_cb_base;
        hw_cfg->input_lum_offset = hw_offset.offset_byte[0];
        hw_cfg->input_cb_offset = hw_offset.offset_byte[1];
        hw_cfg->input_cr_offset  = hw_offset.offset_byte[2];
    }

    // split memory for vp8 partition
    {
        RK_S32 offset = 0;
        Vp8eVpuBuf *buffers = (Vp8eVpuBuf *)ctx->buffers;
        RK_U8 *p_end = NULL;
        RK_U32 buf_size = mpp_buffer_get_size(buffers->hw_out_buf);
        RK_U32 bus_addr = mpp_buffer_get_fd(buffers->hw_out_buf);
        RK_U8 *p_start = mpp_buffer_get_ptr(buffers->hw_out_buf);

        p_end = p_start + 3;
        if (ctx->frame_type == VP8E_FRM_KEY)
            p_end += 7;// frame tag len:I frame 10 byte, P frmae 3 byte.
        vp8e_set_buffer(&ctx->bitbuf[0], p_start, p_end - p_start);

        offset = p_end - p_start;
        hw_cfg->output_strm_base = bus_addr;
        hw_cfg->output_strm_offset = offset;

        p_start = p_end;
        p_end = p_start + buf_size / 10;
        p_end = (RK_U8 *)((size_t)p_end & ~0x7);
        vp8e_set_buffer(&ctx->bitbuf[1], p_start, p_end - p_start);

        offset += p_end - p_start;
        hw_cfg->partition_Base[0] = bus_addr;
        hw_cfg->partition_offset[0] = offset;

        p_start = p_end;
        p_end = mpp_buffer_get_ptr(buffers->hw_out_buf) + buf_size;
        p_end = (RK_U8 *)((size_t)p_end & ~0x7);
        vp8e_set_buffer(&ctx->bitbuf[2], p_start, p_end - p_start);

        offset += p_end - p_start;
        hw_cfg->partition_Base[1] = bus_addr;
        hw_cfg->partition_offset[1] = offset;
        hw_cfg->output_strm_size = p_end - p_start;

        p_start = p_end;
    }

    {
        HalVp8ePicBuf *pic_buf = &ctx->picbuf;

        pic_buf->cur_pic->show = 1;
        pic_buf->cur_pic->poc = ctx->frame_cnt;
        pic_buf->cur_pic->i_frame = (ctx->frame_type == VP8E_FRM_KEY);

        init_picbuf(ctx);

        if (ctx->frame_type == VP8E_FRM_P) {
            pic_buf->cur_pic->p_frame = 1;
            pic_buf->cur_pic->arf = 1;
            pic_buf->cur_pic->grf = 1;
            pic_buf->cur_pic->ipf = 1;
            pic_buf->ref_pic_list[0].search = 1;
            pic_buf->ref_pic_list[1].search = 1;
            pic_buf->ref_pic_list[2].search = 1;
        }

        if (ctx->rc->frame_coded == 0)
            return MPP_OK;

        if (ctx->rc->golden_picture_rate) {
            pic_buf->cur_pic->grf = 1;
            if (!pic_buf->cur_pic->arf)
                pic_buf->ref_pic_list[1].arf = 1;
        }
    }
    set_frame_params(ctx);
    set_picbuf_ref(ctx);
    set_code_frame(ctx);

    return MPP_OK;
}